

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogMessage::Flush(LogMessage *this)

{
  char cVar1;
  LogMessageData *pLVar2;
  int iVar3;
  code *pcVar4;
  int *piVar5;
  size_t sVar6;
  char cVar7;
  long lVar8;
  bool bVar9;
  
  pLVar2 = this->data_;
  if ((pLVar2->has_been_flushed_ == false) && (fLI::FLAGS_minloglevel <= (int)pLVar2->severity_)) {
    sVar6 = *(long *)&(pLVar2->stream_).super_ostream.field_0x30 -
            *(long *)&(pLVar2->stream_).super_ostream.field_0x28;
    pLVar2->num_chars_to_log_ = sVar6;
    pLVar2->num_chars_to_syslog_ = sVar6 - pLVar2->num_prefix_chars_;
    cVar1 = *(char *)(sVar6 + 3 + (long)pLVar2);
    if (cVar1 == '\n') {
      cVar7 = '\0';
    }
    else {
      cVar7 = *(char *)((long)pLVar2 + sVar6 + 4);
      pLVar2->num_chars_to_log_ = sVar6 + 1;
      *(undefined1 *)((long)pLVar2 + sVar6 + 4) = 10;
    }
    this->data_->message_text_[this->data_->num_chars_to_log_] = '\0';
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    pcVar4 = (code *)this->data_->send_method_;
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)((long)&this->allocated_ +
                                            *(long *)&this->data_->field_0x76a8) + -1);
    }
    (*pcVar4)();
    *(long *)(num_messages_ + (long)(int)this->data_->severity_ * 8) =
         *(long *)(num_messages_ + (long)(int)this->data_->severity_ * 8) + 1;
    pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
    pLVar2 = this->data_;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)LogDestination::sink_mutex_);
    if (LogDestination::sinks_ != (long *)0x0) {
      lVar8 = LogDestination::sinks_[1] - *LogDestination::sinks_ >> 3;
      while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
        (**(code **)(**(long **)(*LogDestination::sinks_ + lVar8 * 8) + 0x20))();
      }
    }
    if ((((code *)pLVar2->send_method_ == SendToSink ||
          (code *)pLVar2->send_method_ == SendToSinkAndLog) && (*(long *)&pLVar2->field_0x76a8 == 0)
        ) && ((pLVar2->field_6).outvec_ !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0)) {
      (*(code *)(((pLVar2->field_6).outvec_)->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p)();
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
    if (cVar1 != '\n') {
      this->data_->message_text_[this->data_->num_chars_to_log_ - 1] = cVar7;
    }
    pLVar2 = this->data_;
    iVar3 = pLVar2->preserved_errno_;
    if (iVar3 != 0) {
      piVar5 = __errno_location();
      *piVar5 = iVar3;
    }
    pLVar2->has_been_flushed_ = true;
  }
  return;
}

Assistant:

void LogMessage::Flush() {
  if (data_->has_been_flushed_ || data_->severity_ < FLAGS_minloglevel) {
    return;
  }

  data_->num_chars_to_log_ = data_->stream_.pcount();
  data_->num_chars_to_syslog_ =
      data_->num_chars_to_log_ - data_->num_prefix_chars_;

  // Do we need to add a \n to the end of this message?
  bool append_newline =
      (data_->message_text_[data_->num_chars_to_log_ - 1] != '\n');
  char original_final_char = '\0';

  // If we do need to add a \n, we'll do it by violating the memory of the
  // ostrstream buffer.  This is quick, and we'll make sure to undo our
  // modification before anything else is done with the ostrstream.  It
  // would be preferable not to do things this way, but it seems to be
  // the best way to deal with this.
  if (append_newline) {
    original_final_char = data_->message_text_[data_->num_chars_to_log_];
    data_->message_text_[data_->num_chars_to_log_++] = '\n';
  }
  data_->message_text_[data_->num_chars_to_log_] = '\0';

  // Prevent any subtle race conditions by wrapping a mutex lock around
  // the actual logging action per se.
  {
    std::lock_guard<std::mutex> l{log_mutex};
    (this->*(data_->send_method_))();
    ++num_messages_[static_cast<int>(data_->severity_)];
  }
  LogDestination::WaitForSinks(data_);

  if (append_newline) {
    // Fix the ostrstream back how it was before we screwed with it.
    // It's 99.44% certain that we don't need to worry about doing this.
    data_->message_text_[data_->num_chars_to_log_ - 1] = original_final_char;
  }

  // If errno was already set before we enter the logging call, we'll
  // set it back to that value when we return from the logging call.
  // It happens often that we log an error message after a syscall
  // failure, which can potentially set the errno to some other
  // values.  We would like to preserve the original errno.
  if (data_->preserved_errno_ != 0) {
    errno = data_->preserved_errno_;
  }

  // Note that this message is now safely logged.  If we're asked to flush
  // again, as a result of destruction, say, we'll do nothing on future calls.
  data_->has_been_flushed_ = true;
}